

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiStackLevelInfo *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  char *fmt;
  long lVar10;
  ImGuiStackLevelInfo local_78;
  
  pIVar4 = GImGui;
  uVar5 = (ulong)id;
  pIVar2 = GImGui->CurrentWindow;
  iVar1 = (GImGui->DebugStackTool).StackLevel;
  lVar10 = (long)iVar1;
  if (lVar10 == -1) {
    (GImGui->DebugStackTool).StackLevel = 0;
    local_78.Desc[0x29] = '\0';
    local_78.Desc[0x2a] = '\0';
    local_78.Desc[0x2b] = '\0';
    local_78.Desc[0x2c] = '\0';
    local_78.Desc[0x2d] = '\0';
    local_78.Desc[0x2e] = '\0';
    local_78.Desc[0x2f] = '\0';
    local_78.Desc[0x30] = '\0';
    local_78.Desc[0x31] = '\0';
    local_78.Desc[0x32] = '\0';
    local_78.Desc[0x33] = '\0';
    local_78.Desc[0x34] = '\0';
    local_78.Desc[0x35] = '\0';
    local_78.Desc[0x36] = '\0';
    local_78.Desc[0x37] = '\0';
    local_78.Desc[0x38] = '\0';
    local_78.Desc[0x19] = '\0';
    local_78.Desc[0x1a] = '\0';
    local_78.Desc[0x1b] = '\0';
    local_78.Desc[0x1c] = '\0';
    local_78.Desc[0x1d] = '\0';
    local_78.Desc[0x1e] = '\0';
    local_78.Desc[0x1f] = '\0';
    local_78.Desc[0x20] = '\0';
    local_78.Desc[0x21] = '\0';
    local_78.Desc[0x22] = '\0';
    local_78.Desc[0x23] = '\0';
    local_78.Desc[0x24] = '\0';
    local_78.Desc[0x25] = '\0';
    local_78.Desc[0x26] = '\0';
    local_78.Desc[0x27] = '\0';
    local_78.Desc[0x28] = '\0';
    local_78.Desc[9] = '\0';
    local_78.Desc[10] = '\0';
    local_78.Desc[0xb] = '\0';
    local_78.Desc[0xc] = '\0';
    local_78.Desc[0xd] = '\0';
    local_78.Desc[0xe] = '\0';
    local_78.Desc[0xf] = '\0';
    local_78.Desc[0x10] = '\0';
    local_78.Desc[0x11] = '\0';
    local_78.Desc[0x12] = '\0';
    local_78.Desc[0x13] = '\0';
    local_78.Desc[0x14] = '\0';
    local_78.Desc[0x15] = '\0';
    local_78.Desc[0x16] = '\0';
    local_78.Desc[0x17] = '\0';
    local_78.Desc[0x18] = '\0';
    local_78.ID = 0;
    local_78.QueryFrameCount = '\0';
    local_78.QuerySuccess = false;
    local_78._6_1_ = 0;
    local_78.Desc[0] = '\0';
    local_78.Desc[1] = '\0';
    local_78.Desc[2] = '\0';
    local_78.Desc[3] = '\0';
    local_78.Desc[4] = '\0';
    local_78.Desc[5] = '\0';
    local_78.Desc[6] = '\0';
    local_78.Desc[7] = '\0';
    local_78.Desc[8] = '\0';
    ImVector<ImGuiStackLevelInfo>::resize
              (&(pIVar4->DebugStackTool).Results,(pIVar2->IDStack).Size + 1,&local_78);
    lVar10 = 0;
    for (lVar6 = 0; lVar9 = (long)(pIVar2->IDStack).Size, lVar6 <= lVar9; lVar6 = lVar6 + 1) {
      uVar8 = id;
      if (lVar6 < lVar9) {
        uVar8 = (pIVar2->IDStack).Data[lVar6];
      }
      *(uint *)(((pIVar4->DebugStackTool).Results.Data)->Desc + lVar10 + -7) = uVar8;
      lVar10 = lVar10 + 0x40;
    }
    return;
  }
  if (iVar1 != (pIVar2->IDStack).Size) {
    return;
  }
  pIVar3 = (GImGui->DebugStackTool).Results.Data;
  switch(data_type) {
  case 4:
    fmt = "%d";
    uVar5 = (ulong)data_id & 0xffffffff;
    goto LAB_001bf1e7;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar7 = strlen((char *)data_id);
    }
    else {
      sVar7 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar3[lVar10].Desc,0x39,"%.*s",sVar7,data_id);
    break;
  case 0xc:
    ImFormatString(pIVar3[lVar10].Desc,0x39,"(void*)0x%p",data_id);
    break;
  case 0xd:
    if (pIVar3[lVar10].Desc[0] != '\0') {
      return;
    }
    fmt = "0x%08X [override]";
LAB_001bf1e7:
    ImFormatString(pIVar3[lVar10].Desc,0x39,fmt,uVar5);
  }
  pIVar3[lVar10].QuerySuccess = true;
  pIVar3[lVar10].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}